

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O0

FT_Error hash_init(FT_Hash hash,FT_Bool is_num,FT_Memory memory)

{
  FT_Hashnode *ppFVar1;
  FT_Error local_28 [2];
  FT_Error error;
  FT_UInt sz;
  FT_Memory memory_local;
  FT_Hash pFStack_10;
  FT_Bool is_num_local;
  FT_Hash hash_local;
  
  local_28[1] = 0xf1;
  hash->size = 0xf1;
  hash->limit = 0x50;
  hash->used = 0;
  if (is_num == '\0') {
    hash->lookup = hash_str_lookup;
    hash->compare = hash_str_compare;
  }
  else {
    hash->lookup = hash_num_lookup;
    hash->compare = hash_num_compare;
  }
  _error = memory;
  memory_local._7_1_ = is_num;
  pFStack_10 = hash;
  ppFVar1 = (FT_Hashnode *)ft_mem_realloc(memory,8,0,0xf1,(void *)0x0,local_28);
  pFStack_10->table = ppFVar1;
  return local_28[0];
}

Assistant:

static FT_Error
  hash_init( FT_Hash    hash,
             FT_Bool    is_num,
             FT_Memory  memory )
  {
    FT_UInt   sz = INITIAL_HT_SIZE;
    FT_Error  error;


    hash->size  = sz;
    hash->limit = sz / 3;
    hash->used  = 0;

    if ( is_num )
    {
      hash->lookup  = hash_num_lookup;
      hash->compare = hash_num_compare;
    }
    else
    {
      hash->lookup  = hash_str_lookup;
      hash->compare = hash_str_compare;
    }

    FT_MEM_NEW_ARRAY( hash->table, sz );

    return error;
  }